

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.cpp
# Opt level: O2

ostream * operator<<(ostream *os,help_type *param_2)

{
  std::operator<<(os,
                  "Determine how to measure amount(s) of water using buckets of different capacities.\nAdd buckets and specify amount to measure with arguments below.\nAn absent measure would output ways to measure all amounts up to total capacity.\nArguments are: -a | --add-bucket    add a bucket of specific capacity - repeat for each\n               -m | --measure       specify amount of water to measure\n               -s | --max-steps     specify maximum allowed steps, defaults to 100\n               -h | --help          output this message\n\nBuckets will be named from A(n), B(n), C(n) etc where n is the bucket\'s capacity\nUser will be asked to extend number of steps if they are reached.\nNormally this will happen if no odd size bucket was specified.\n"
                 );
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const params::help_type&)
{
	os << "Determine how to measure amount(s) of water using buckets of different capacities.\n"
		"Add buckets and specify amount to measure with arguments below.\n"
		"An absent measure would output ways to measure all amounts up to total capacity.\n"
		"Arguments are: -a | --add-bucket    add a bucket of specific capacity - repeat for each\n"
		"               -m | --measure       specify amount of water to measure\n"
		"               -s | --max-steps     specify maximum allowed steps, defaults to 100\n"
		"               -h | --help          output this message\n\n"
		"Buckets will be named from A(n), B(n), C(n) etc where n is the bucket's capacity\n"
		"User will be asked to extend number of steps if they are reached.\n"
		"Normally this will happen if no odd size bucket was specified.\n";
	return os;
}